

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_loose_and_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *cclass;
  char *cclass_00;
  int yypos767;
  int yythunkpos767;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = 0;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar3 = yy_list_prefix_expr(G);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-2,0,"yySet");
LAB_00114a2b:
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      yy__(G);
      iVar4 = yymatchString(G,"and");
      if (iVar4 == 0) break;
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"",cclass);
      if (iVar5 != 0) break;
      G->pos = iVar4;
      G->thunkpos = iVar3;
      yy__(G);
      iVar4 = yy_list_prefix_expr(G);
      if (iVar4 == 0) break;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_1_loose_and_expr,G->begin,G->end,"yy_1_loose_and_expr");
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yy__(G);
    iVar4 = yymatchString(G,"andthen");
    if (iVar4 != 0) {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"",cclass_00);
      if (iVar5 != 0) goto LAB_00114b63;
      G->pos = iVar4;
      G->thunkpos = iVar3;
      yy__(G);
      iVar4 = yy_list_prefix_expr(G);
      if (iVar4 == 0) goto LAB_00114b63;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_2_loose_and_expr,G->begin,G->end,"yy_2_loose_and_expr");
      goto LAB_00114a2b;
    }
LAB_00114b63:
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyDo(G,yy_3_loose_and_expr,G->begin,G->end,"yy_3_loose_and_expr");
    yyDo(G,yyPop,2,0,"yyPop");
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

YY_RULE(int) yy_loose_and_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "loose_and_expr"));
  if (!yy_list_prefix_expr(G))  goto l764;
  yyDo(G, yySet, -2, 0, "yySet");

  l765:;	
  {  int yypos766= G->pos, yythunkpos766= G->thunkpos;
  {  int yypos767= G->pos, yythunkpos767= G->thunkpos;  if (!yy__(G))  goto l768;
  if (!yymatchString(G, "and")) goto l768;

  {  int yypos769= G->pos, yythunkpos769= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l769;
  goto l768;
  l769:;	  G->pos= yypos769; G->thunkpos= yythunkpos769;
  }  if (!yy__(G))  goto l768;
  if (!yy_list_prefix_expr(G))  goto l768;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_loose_and_expr, G->begin, G->end, "yy_1_loose_and_expr");
  goto l767;
  l768:;	  G->pos= yypos767; G->thunkpos= yythunkpos767;  if (!yy__(G))  goto l766;
  if (!yymatchString(G, "andthen")) goto l766;

  {  int yypos770= G->pos, yythunkpos770= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l770;
  goto l766;
  l770:;	  G->pos= yypos770; G->thunkpos= yythunkpos770;
  }  if (!yy__(G))  goto l766;
  if (!yy_list_prefix_expr(G))  goto l766;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_loose_and_expr, G->begin, G->end, "yy_2_loose_and_expr");

  }
  l767:;	  goto l765;
  l766:;	  G->pos= yypos766; G->thunkpos= yythunkpos766;
  }  yyDo(G, yy_3_loose_and_expr, G->begin, G->end, "yy_3_loose_and_expr");
  yyprintf((stderr, "  ok   loose_and_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l764:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "loose_and_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}